

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::extendWithLogicalBasis(HModel *this,int firstcol,int lastcol,int firstrow,int lastrow)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint *puVar5;
  reference pvVar6;
  reference pvVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int var_1;
  int row_1;
  int var;
  int col;
  int row;
  int rowShift;
  bool basisOK;
  int local_newNumTot;
  int local_newNumRow;
  int local_newNumCol;
  int local_oldNumTot;
  int local_oldNumRow;
  int local_oldNumCol;
  int numAddTot;
  int numAddRow;
  int numAddCol;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  value_type in_stack_ffffffffffffff48;
  value_type in_stack_ffffffffffffff4c;
  HModel *in_stack_ffffffffffffff50;
  HModel *in_stack_ffffffffffffff58;
  HModel *in_stack_ffffffffffffff60;
  value_type in_stack_ffffffffffffff68;
  HModel *in_stack_ffffffffffffff70;
  value_type in_stack_ffffffffffffff78;
  HModel *in_stack_ffffffffffffff80;
  int local_6c;
  int local_64;
  int local_60;
  int local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_20 = (in_EDX - in_ESI) + 1;
  local_24 = 0;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  piVar4 = std::max<int>(&local_20,&local_24);
  local_1c = *piVar4;
  local_2c = (local_18 - local_14) + 1;
  local_30 = 0;
  piVar4 = std::max<int>(&local_2c,&local_30);
  local_28 = *piVar4;
  local_34 = local_1c + local_28;
  if (local_34 != 0) {
    local_38 = local_c;
    local_3c = local_14;
    local_40 = local_c + local_14;
    local_48 = local_10 + 1;
    puVar5 = (uint *)std::max<int>(&local_38,&local_48);
    local_44 = *puVar5;
    local_50 = local_18 + 1;
    puVar5 = (uint *)std::max<int>(&local_3c,&local_50);
    local_4c = *puVar5;
    uVar2 = local_44 + local_4c;
    printf("extendWithLogicalBasis\n");
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    printf("numCol/Row/Tot = %d/%d/%d\n",(ulong)*(uint *)(in_RDI + 0x60c),
           (ulong)*(uint *)(in_RDI + 0x610),(ulong)*(uint *)(in_RDI + 0x614));
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    printf("local_newNumCol/Row/Tot = %d/%d/%d\n",(ulong)local_44,(ulong)local_4c,(ulong)uVar2);
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    bVar1 = nonbasicFlagBasicIndex_OK
                      (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                       (int)in_stack_ffffffffffffff50);
    if (!bVar1) {
      printf("HModel::extendWithLogicalBasis: basisOK = %d\n",(ulong)bVar1);
    }
    if (local_3c < *(int *)(in_RDI + 0x610)) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
    }
    if (local_40 < *(int *)(in_RDI + 0x614)) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
    }
    iVar3 = *(int *)(in_RDI + 0x60c) - local_38;
    local_60 = local_3c;
    if (0 < iVar3) {
      while (local_60 = local_60 + -1, -1 < local_60) {
        in_stack_ffffffffffffff44 = iVar3;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_60);
        *pvVar6 = in_stack_ffffffffffffff44 + *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff48 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar6 = in_stack_ffffffffffffff48;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff4c = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar6 = in_stack_ffffffffffffff4c;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff50 = (HModel *)*pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar7 = (value_type)in_stack_ffffffffffffff50;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff58 = (HModel *)*pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar7 = (value_type)in_stack_ffffffffffffff58;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7c8),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff60 = (HModel *)*pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7c8),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar7 = (value_type)in_stack_ffffffffffffff60;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff68 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar7 = in_stack_ffffffffffffff68;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff70 = (HModel *)*pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar7 = (value_type)in_stack_ffffffffffffff70;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x810),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff78 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x810),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar7 = in_stack_ffffffffffffff78;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),
                            (long)(local_38 + local_60));
        in_stack_ffffffffffffff80 = (HModel *)*pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),
                            (long)(*(int *)(in_RDI + 0x60c) + local_60));
        *pvVar7 = (value_type)in_stack_ffffffffffffff80;
      }
    }
    for (local_64 = local_c; local_64 <= local_10; local_64 = local_64 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_64);
      *pvVar6 = 1;
    }
    for (local_6c = local_14; local_6c <= local_18; local_6c = local_6c + 1) {
      in_stack_ffffffffffffff40 = *(int *)(in_RDI + 0x60c) + local_6c;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),
                          (long)in_stack_ffffffffffffff40);
      *pvVar6 = 0;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_6c);
      *pvVar6 = in_stack_ffffffffffffff40;
    }
    initPh2ColCost(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (int)in_stack_ffffffffffffff58);
    initPh2RowCost(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    initPh2ColBound(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                    SUB84(in_stack_ffffffffffffff68,0));
    initPh2RowBound(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                    SUB84(in_stack_ffffffffffffff68,0));
    initValueFromNonbasic
              (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               SUB84(in_stack_ffffffffffffff78,0));
    nonbasicFlagBasicIndex_OK
              (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
               (int)in_stack_ffffffffffffff50);
    *(int *)(in_RDI + 0x578) = local_28 + *(int *)(in_RDI + 0x578);
    if (local_1c != 0) {
      mlFg_Update((HModel *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c);
    }
    if (local_28 != 0) {
      mlFg_Update((HModel *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c);
    }
  }
  return;
}

Assistant:

void HModel::extendWithLogicalBasis(int firstcol, int lastcol, int firstrow, int lastrow) {
  // Add nonbasic structurals and basic slacks according to model bounds.
  //
  // NB Assumes that the basis data structures and work vectors on
  // entry are assigned for columns 0..firstcol-1 and rows
  // 0..firstrow-1 and that they constitute a valid basis. Thus they
  // correspond to "firstcol" number of columns and "firstrow" number
  // of rows. Also assumes that numCol and numRow have already been
  // updated to correspond to any additional columns and rows. This is
  // necessary so that generic methods can be used to assign model
  // data to arrays dimensioned 0..numTot
  //
  // Null intervals firstcol...lastcol and firstrow...lastrow are
  // permitted, but this is achieved by setting the "last" to be less
  // than "first" since the latter is used to indicate what's
  // currently in the data structure.

  assert(firstcol >= 0);
  assert(firstrow >= 0);

  //printf("Called extendWithLogicalBasis:\n   numCol =   %d\n   firstcol = %d\n   lastcol =  %d\n   numRow =   %d\n   firstrow = %d\n   lastrow =  %d\n", numCol, firstcol, lastcol, numRow, firstrow, lastrow);
  // Determine the numbers of columns and rows to be added

  int numAddCol = max(lastcol-firstcol+1, 0);
  int numAddRow = max(lastrow-firstrow+1, 0);
  int numAddTot = numAddCol + numAddRow;
  if (numAddTot == 0) return;

  // Determine the numbers of columns and rows before and after this method

  int local_oldNumCol = firstcol;
  int local_oldNumRow = firstrow;
  int local_oldNumTot = local_oldNumCol + local_oldNumRow;

  int local_newNumCol = max(local_oldNumCol, lastcol+1);
  int local_newNumRow = max(local_oldNumRow, lastrow+1);
  int local_newNumTot = local_newNumCol + local_newNumRow;

  printf("extendWithLogicalBasis\n");cout<<flush;
  printf("numCol/Row/Tot = %d/%d/%d\n", numCol, numRow, numTot);cout<<flush;
  printf("local_newNumCol/Row/Tot = %d/%d/%d\n", local_newNumCol, local_newNumRow, local_newNumTot);cout<<flush;
  assert(local_newNumCol == numCol);
  assert(local_newNumRow == numRow);
  assert(local_newNumTot == numTot);
  //ToDo: Replace references to local_newNum* by references to num* from here on

#ifdef JAJH_dev
  // Check that columns 0..firstcol-1 and rows 0..firstrow-1 constitute a valid basis.
  bool basisOK = nonbasicFlagBasicIndex_OK(local_oldNumCol, local_oldNumRow);
  if (!basisOK) printf("HModel::extendWithLogicalBasis: basisOK = %d\n", basisOK);
  assert(basisOK);
#endif
    
  //  Resize if necessary

  if (numRow > local_oldNumRow) {
    basicIndex.resize(numRow);

    baseLower.resize(numRow);
    baseUpper.resize(numRow);
    baseValue.resize(numRow);
  }
  if (numTot > local_oldNumTot) {
    nonbasicFlag.resize(numTot);
    nonbasicMove.resize(numTot);

    workCost.resize(numTot);
    workDual.resize(numTot);
    workShift.resize(numTot);

    workLower.resize(numTot);
    workUpper.resize(numTot);
    workRange.resize(numTot);
    workValue.resize(numTot);
  }

  // Shift the row data in basicIndex, nonbasicFlag and nonbasicMove if necessary

  int rowShift = numCol - local_oldNumCol;
  if (rowShift > 0) {
    //printf("Shifting row data by %d using row=%d..0\n", rowShift, local_oldNumRow-1);cout << flush;
    for (int row = local_oldNumRow-1; row >=0; row--) {
      basicIndex[row] += rowShift;
      nonbasicFlag[numCol+row] = nonbasicFlag[local_oldNumCol+row];
      nonbasicMove[numCol+row] = nonbasicMove[local_oldNumCol+row];

      workCost[numCol+row] = workCost[local_oldNumCol+row];
      workDual[numCol+row] = workDual[local_oldNumCol+row];
      workShift[numCol+row] = workShift[local_oldNumCol+row];

      workLower[numCol+row] = workLower[local_oldNumCol+row];
      workUpper[numCol+row] = workUpper[local_oldNumCol+row];
      workRange[numCol+row] = workRange[local_oldNumCol+row];
      workValue[numCol+row] = workValue[local_oldNumCol+row];

      //printf("Setting basicIndex[%2d] = %2d; nonbasicFlag[%2d] = %2d; nonbasicMove[%2d] = %2d\n", 
      //      row, basicIndex[row],
      //      numCol+row, nonbasicFlag[local_oldNumCol+row],
      //      numCol+row, nonbasicMove[local_oldNumCol+row]);cout << flush;
    }
  }
  //rp_basis();
  //printf("After possibly shifting row data\n");
  //Make any new columns nonbasic
  //  printf("Make any new cols nonbasic: %d %d %d\n", numCol, firstcol, lastcol);
  for (int col = firstcol; col <= lastcol; col++) {
    int var = col;
    //    printf("Setting nonbasicFlag[%2d] = NONBASIC_FLAG_TRUE; Setting nonbasicMove[%2d] = %2d\n", var, var, get_nonbasicMoveCol(var));
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
    //    printf("Calling get_nonbasicMoveCol(%2d)\n", var);
    //    nonbasicMove[var] = get_nonbasicMoveCol(var);
  }
  //Make any new rows basic
  //  printf("Make any new rows basic: %d %d %d\n", numRow, firstrow, lastrow);
  for (int row = firstrow; row <= lastrow; row++) {
    int var = numCol + row;
    //    printf("Setting nonbasicFlag[%2d] = NONBASIC_FLAG_FALSE; Setting basicIndex[%2d] = %2d\n", var, row, var);
    nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
    basicIndex[row] = var;
  }

  // Initialise costs for the new columns and rows
  initPh2ColCost(firstcol, lastcol);
  initPh2RowCost(firstrow, lastrow);
  
  // Initialise bounds for the new columns and rows
  initPh2ColBound(firstcol, lastcol);
  initPh2RowBound(firstrow, lastrow);
  
  // Initialise values (and nonbasicMove) for the new columns
  initValueFromNonbasic(firstcol, lastcol);

#ifdef JAJH_dev
  // Check that columns 0..firstcol-1 and rows 0..firstrow-1 constitute a valid basis.
  basisOK = nonbasicFlagBasicIndex_OK(numCol, numRow);
  assert(basisOK);
#endif

  numBasicLogicals += numAddRow;

  //  rp_basis();
  
  //Deduce the consequences of adding new columns and/or rows
  if (numAddCol) mlFg_Update(mlFg_action_NewCols);
  if (numAddRow) mlFg_Update(mlFg_action_NewRows);

}